

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  __pid_t _Var3;
  App *pAVar4;
  Option *pOVar5;
  ulong uVar6;
  char *__name;
  allocator local_2a79;
  string local_2a78;
  allocator local_2a51;
  string local_2a50;
  allocator local_2a29;
  string local_2a28;
  allocator local_2a01;
  string local_2a00;
  allocator local_29d9;
  string local_29d8;
  allocator local_29b1;
  string local_29b0;
  allocator local_2989;
  string local_2988;
  allocator local_2961;
  string local_2960;
  allocator local_2939;
  string local_2938;
  allocator local_2911;
  string local_2910;
  allocator local_28e9;
  string local_28e8;
  allocator local_28c1;
  string local_28c0;
  allocator local_2899;
  string local_2898;
  undefined1 local_2872;
  allocator local_2871;
  undefined1 local_2870 [6];
  bool enablePerMessageDeflate;
  allocator local_2849;
  string local_2848;
  allocator local_2821;
  string local_2820;
  int local_27fc;
  string local_27f8 [4];
  int ret;
  ofstream f;
  ParseError *e;
  string local_25e0;
  allocator local_25b9;
  string local_25b8;
  allocator local_2591;
  string local_2590;
  allocator local_2569;
  string local_2568;
  allocator local_2541;
  string local_2540;
  allocator local_2519;
  string local_2518;
  allocator local_24f1;
  string local_24f0;
  allocator local_24c9;
  string local_24c8;
  allocator local_24a1;
  string local_24a0;
  allocator local_2479;
  string local_2478;
  allocator local_2451;
  string local_2450;
  allocator local_2429;
  string local_2428;
  allocator local_2401;
  string local_2400;
  allocator local_23d9;
  string local_23d8;
  allocator local_23b1;
  string local_23b0;
  allocator local_2389;
  string local_2388;
  allocator local_2361;
  string local_2360;
  allocator local_2339;
  string local_2338;
  App *local_2318;
  App *runApp;
  string local_2308;
  allocator local_22e1;
  string local_22e0;
  allocator local_22b9;
  string local_22b8;
  allocator local_2291;
  string local_2290;
  allocator local_2269;
  string local_2268;
  allocator local_2241;
  string local_2240;
  allocator local_2219;
  string local_2218;
  allocator local_21f1;
  string local_21f0;
  allocator local_21c9;
  string local_21c8;
  allocator local_21a1;
  string local_21a0;
  allocator local_2179;
  string local_2178;
  allocator local_2151;
  string local_2150;
  allocator local_2129;
  string local_2128;
  allocator local_2101;
  string local_2100;
  allocator local_20d9;
  string local_20d8;
  allocator local_20b1;
  string local_20b0;
  allocator local_2089;
  string local_2088;
  allocator local_2061;
  string local_2060;
  allocator local_2039;
  string local_2038;
  allocator local_2011;
  string local_2010;
  allocator local_1fe9;
  string local_1fe8;
  allocator local_1fc1;
  string local_1fc0;
  App *local_1fa0;
  App *cobra2sentry;
  string local_1f90;
  allocator local_1f69;
  string local_1f68;
  allocator local_1f41;
  string local_1f40;
  allocator local_1f19;
  string local_1f18;
  allocator local_1ef1;
  string local_1ef0;
  allocator local_1ec9;
  string local_1ec8;
  allocator local_1ea1;
  string local_1ea0;
  allocator local_1e79;
  string local_1e78;
  allocator local_1e51;
  string local_1e50;
  allocator local_1e29;
  string local_1e28;
  allocator local_1e01;
  string local_1e00;
  allocator local_1dd9;
  string local_1dd8;
  allocator local_1db1;
  string local_1db0;
  allocator local_1d89;
  string local_1d88;
  allocator local_1d61;
  string local_1d60;
  allocator local_1d39;
  string local_1d38;
  allocator local_1d11;
  string local_1d10;
  allocator local_1ce9;
  string local_1ce8;
  allocator local_1cc1;
  string local_1cc0;
  allocator local_1c99;
  string local_1c98;
  allocator local_1c71;
  string local_1c70;
  allocator local_1c49;
  string local_1c48;
  allocator local_1c21;
  string local_1c20;
  allocator local_1bf9;
  string local_1bf8;
  App *local_1bd8;
  App *cobra2statsd;
  string local_1bc8;
  allocator local_1ba1;
  string local_1ba0;
  allocator local_1b79;
  string local_1b78;
  allocator local_1b51;
  string local_1b50;
  allocator local_1b29;
  string local_1b28;
  allocator local_1b01;
  string local_1b00;
  allocator local_1ad9;
  string local_1ad8;
  allocator local_1ab1;
  string local_1ab0;
  allocator local_1a89;
  string local_1a88;
  allocator local_1a61;
  string local_1a60;
  allocator local_1a39;
  string local_1a38;
  allocator local_1a11;
  string local_1a10;
  allocator local_19e9;
  string local_19e8;
  allocator local_19c1;
  string local_19c0;
  allocator local_1999;
  string local_1998;
  allocator local_1971;
  string local_1970;
  allocator local_1949;
  string local_1948;
  allocator local_1921;
  string local_1920;
  App *local_1900;
  App *cobraPublish;
  string local_18f0;
  allocator local_18c9;
  string local_18c8;
  allocator local_18a1;
  string local_18a0;
  allocator local_1879;
  string local_1878;
  allocator local_1851;
  string local_1850;
  allocator local_1829;
  string local_1828;
  allocator local_1801;
  string local_1800;
  allocator local_17d9;
  string local_17d8;
  allocator local_17b1;
  string local_17b0;
  allocator local_1789;
  string local_1788;
  allocator local_1761;
  string local_1760;
  allocator local_1739;
  string local_1738;
  allocator local_1711;
  string local_1710;
  allocator local_16e9;
  string local_16e8;
  App *local_16c8;
  App *cobraSubscribeApp;
  string local_16b8;
  allocator local_1691;
  string local_1690;
  allocator local_1669;
  string local_1668;
  allocator local_1641;
  string local_1640;
  allocator local_1619;
  string local_1618;
  allocator local_15f1;
  string local_15f0;
  allocator local_15c9;
  string local_15c8;
  allocator local_15a1;
  string local_15a0;
  allocator local_1579;
  string local_1578;
  allocator local_1551;
  string local_1550;
  allocator local_1529;
  string local_1528;
  allocator local_1501;
  string local_1500;
  allocator local_14d9;
  string local_14d8;
  allocator local_14b1;
  string local_14b0;
  App *local_1490;
  App *redisSubscribeApp;
  string local_1480;
  allocator local_1459;
  string local_1458;
  allocator local_1431;
  string local_1430;
  allocator local_1409;
  string local_1408;
  allocator local_13e1;
  string local_13e0;
  allocator local_13b9;
  string local_13b8;
  allocator local_1391;
  string local_1390;
  allocator local_1369;
  string local_1368;
  allocator local_1341;
  string local_1340;
  allocator local_1319;
  string local_1318;
  allocator local_12f1;
  string local_12f0;
  allocator local_12c9;
  string local_12c8;
  allocator local_12a1;
  string local_12a0;
  allocator local_1279;
  string local_1278;
  App *local_1258;
  App *redisPublishApp;
  string local_1248;
  allocator local_1221;
  string local_1220;
  allocator local_11f9;
  string local_11f8;
  allocator local_11d1;
  string local_11d0;
  allocator local_11a9;
  string local_11a8;
  allocator local_1181;
  string local_1180;
  allocator local_1159;
  string local_1158;
  allocator local_1131;
  string local_1130;
  allocator local_1109;
  string local_1108;
  allocator local_10e1;
  string local_10e0;
  allocator local_10b9;
  string local_10b8;
  allocator local_1091;
  string local_1090;
  allocator local_1069;
  string local_1068;
  allocator local_1041;
  string local_1040;
  allocator local_1019;
  string local_1018;
  allocator local_ff1;
  string local_ff0;
  allocator local_fc9;
  string local_fc8;
  allocator local_fa1;
  string local_fa0;
  allocator local_f79;
  string local_f78;
  allocator local_f51;
  string local_f50;
  allocator local_f29;
  string local_f28;
  allocator local_f01;
  string local_f00;
  allocator local_ed9;
  string local_ed8;
  allocator local_eb1;
  string local_eb0;
  allocator local_e89;
  string local_e88;
  allocator local_e61;
  string local_e60;
  allocator local_e39;
  string local_e38;
  allocator local_e11;
  string local_e10;
  App *local_df0;
  App *httpClientApp;
  string local_de0;
  allocator local_db9;
  string local_db8;
  allocator local_d91;
  string local_d90;
  allocator local_d69;
  string local_d68;
  App *local_d48;
  App *pingPongApp;
  string local_d38;
  allocator local_d11;
  string local_d10;
  allocator local_ce9;
  string local_ce8;
  allocator local_cc1;
  string local_cc0;
  allocator local_c99;
  string local_c98;
  allocator local_c71;
  string local_c70;
  App *local_c50;
  App *broadcastServerApp;
  string local_c40;
  allocator local_c19;
  string local_c18;
  allocator local_bf1;
  string local_bf0;
  allocator local_bc9;
  string local_bc8;
  allocator local_ba1;
  string local_ba0;
  allocator local_b79;
  string local_b78;
  App *local_b58;
  App *echoServerApp;
  string local_b48;
  allocator local_b21;
  string local_b20;
  allocator local_af9;
  string local_af8;
  allocator local_ad1;
  string local_ad0;
  allocator local_aa9;
  string local_aa8;
  allocator local_a81;
  string local_a80;
  App *local_a60;
  App *chatApp;
  string local_a50;
  allocator local_a29;
  string local_a28;
  allocator local_a01;
  string local_a00;
  allocator local_9d9;
  string local_9d8;
  allocator local_9b1;
  string local_9b0;
  allocator local_989;
  string local_988;
  App *local_968;
  App *connectApp;
  string local_958;
  allocator local_931;
  string local_930;
  allocator local_909;
  string local_908;
  allocator local_8e1;
  string local_8e0;
  allocator local_8b9;
  string local_8b8;
  allocator local_891;
  string local_890;
  allocator local_869;
  string local_868;
  allocator local_841;
  string local_840;
  App *local_820;
  App *transferApp;
  string local_810;
  allocator local_7e9;
  string local_7e8;
  allocator local_7c1;
  string local_7c0;
  allocator local_799;
  string local_798;
  allocator local_771;
  string local_770;
  allocator local_749;
  string local_748;
  allocator local_721;
  string local_720;
  allocator local_6f9;
  string local_6f8;
  App *local_6d8;
  App *receiveApp;
  string local_6c8;
  allocator local_6a1;
  string local_6a0;
  allocator local_679;
  string local_678;
  allocator local_651;
  string local_650;
  allocator local_629;
  string local_628;
  allocator local_601;
  string local_600;
  allocator local_5d9;
  string local_5d8;
  allocator local_5b1;
  string local_5b0;
  App *local_590;
  App *sendApp;
  int jobs;
  int count;
  int delayMs;
  int maxRedirects;
  int transferTimeout;
  int connectTimeOut;
  int statsdPort;
  int redisPort;
  int port;
  bool local_55c;
  bool local_55b;
  bool local_55a;
  bool disableAutomaticReconnection;
  bool stress;
  bool strict;
  bool compress;
  bool save;
  bool verbose;
  bool followRedirects;
  bool headersOnly;
  string appsConfigPath;
  string redisPassword;
  undefined1 local_510 [8];
  string redisHosts;
  string dsn;
  string fields;
  undefined1 local_4a8 [8];
  string prefix;
  string rolesecret;
  string rolename;
  string endpoint;
  string appkey;
  string password;
  string message;
  string channel;
  string pidfile;
  undefined1 local_380 [8];
  string hostname;
  string output;
  string headers;
  string data;
  string user;
  string path;
  undefined1 local_2b8 [8];
  string url;
  string local_290;
  allocator local_269;
  string local_268;
  undefined1 local_248 [8];
  App app;
  anon_class_1_0_00000001 local_39;
  undefined1 local_38 [8];
  LogFunc logFunc;
  char **argv_local;
  int argc_local;
  
  logFunc._M_invoker = (_Invoker_type)argv;
  ix::initNetSystem();
  std::function<void(char_const*)>::function<main::__0,void>
            ((function<void(char_const*)> *)local_38,&local_39);
  ix::IXCoreLogger::setLogFunction((LogFunc *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"ws is a websocket tool",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_290,"",(allocator *)(url.field_2._M_local_buf + 0xf));
  CLI::App::App((App *)local_248,&local_268,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)(url.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  CLI::App::require_subcommand((App *)local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_2b8,"ws://127.0.0.1:8008",
             (allocator *)(path.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(user.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(data.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(headers.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(hostname.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_380,"127.0.0.1",(allocator *)(pidfile.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(pidfile.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(channel.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(message.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(password.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(appkey.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(endpoint.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(rolename.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(rolesecret.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(prefix.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_4a8,"ws.test.v0",(allocator *)(fields.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fields.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(dsn.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(redisHosts.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_510,"127.0.0.1",(allocator *)(redisPassword.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(redisPassword.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(appsConfigPath.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stress,"appsConfig.json",(allocator *)&disableAutomaticReconnection);
  std::allocator<char>::~allocator((allocator<char> *)&disableAutomaticReconnection);
  local_55a = false;
  local_55b = false;
  local_55c = false;
  port._3_1_ = 0;
  port._2_1_ = 0;
  port._1_1_ = 0;
  port._0_1_ = 0;
  redisPort._3_1_ = 0;
  statsdPort = 0x1f48;
  connectTimeOut = 0x18eb;
  transferTimeout = 0x1fbd;
  maxRedirects = 0x3c;
  delayMs = 0x708;
  count = 5;
  jobs = -1;
  sendApp._4_4_ = 1;
  sendApp._0_4_ = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b0,"send",&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d8,"Send a file",&local_5d9);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_5b0,&local_5d8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  local_590 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_600,"url",&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_628,"Connection url",&local_629);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_600,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8
                      ,&local_628);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  pAVar4 = local_590;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_650,"path",&local_651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_678,"Path to the file to send",&local_679);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_650,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&user.field_2 + 8),&local_678);
  pOVar5 = CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  CLI::Option::check(pOVar5,(Validator *)CLI::ExistingPath);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  pAVar4 = local_590;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a0,"--pidfile",&local_6a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c8,"Pid file",(allocator *)((long)&receiveApp + 7))
  ;
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_6a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&channel.field_2 + 8),&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&receiveApp + 7));
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6f8,"receive",&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_720,"Receive a file",&local_721);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_6f8,&local_720);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  local_6d8 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_748,"url",&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_770,"Connection url",&local_771);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_748,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8
                      ,&local_770);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  pAVar4 = local_6d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_798,"--delay",&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7c0,
             "Delay (ms) to wait after receiving a fragment to artificially slow down the receiver",
             &local_7c1);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_798,&jobs,&local_7c0);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  pAVar4 = local_6d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e8,"--pidfile",&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_810,"Pid file",(allocator *)((long)&transferApp + 7));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_7e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&channel.field_2 + 8),&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator((allocator<char> *)((long)&transferApp + 7));
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_840,"transfer",&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_868,"Broadcasting server",&local_869);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_840,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  local_820 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_890,"--port",&local_891);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8b8,"Connection url",&local_8b9);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_890,&statsdPort,&local_8b8);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
  std::__cxx11::string::~string((string *)&local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  pAVar4 = local_820;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8e0,"--host",&local_8e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_908,"Hostname",&local_909);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_8e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
             &local_908);
  std::__cxx11::string::~string((string *)&local_908);
  std::allocator<char>::~allocator((allocator<char> *)&local_909);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
  pAVar4 = local_820;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_930,"--pidfile",&local_931);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_958,"Pid file",(allocator *)((long)&connectApp + 7))
  ;
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_930,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&channel.field_2 + 8),&local_958);
  std::__cxx11::string::~string((string *)&local_958);
  std::allocator<char>::~allocator((allocator<char> *)((long)&connectApp + 7));
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator((allocator<char> *)&local_931);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_988,"connect",&local_989);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9b0,"Connect to a remote server",&local_9b1);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_988,&local_9b0);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  local_968 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9d8,"url",&local_9d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a00,"Connection url",&local_a01);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_9d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8
                      ,&local_a00);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_a01);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  pAVar4 = local_968;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a28,"-d",&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a50,"Disable Automatic Reconnection",(allocator *)((long)&chatApp + 7)
            );
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_a28,(bool *)((long)&redisPort + 3),&local_a50);
  std::__cxx11::string::~string((string *)&local_a50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&chatApp + 7));
  std::__cxx11::string::~string((string *)&local_a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a80,"chat",&local_a81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_aa8,"Group chat",&local_aa9);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_a80,&local_aa8);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa9);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator((allocator<char> *)&local_a81);
  local_a60 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ad0,"url",&local_ad1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_af8,"Connection url",&local_af9);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_ad0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8
                      ,&local_af8);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator((allocator<char> *)&local_af9);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
  pAVar4 = local_a60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b20,"user",&local_b21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b48,"User name",(allocator *)((long)&echoServerApp + 7));
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_b20,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&data.field_2 + 8),&local_b48);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_b48);
  std::allocator<char>::~allocator((allocator<char> *)((long)&echoServerApp + 7));
  std::__cxx11::string::~string((string *)&local_b20);
  std::allocator<char>::~allocator((allocator<char> *)&local_b21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b78,"echo_server",&local_b79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ba0,"Echo server",&local_ba1);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_b78,&local_ba0);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
  std::__cxx11::string::~string((string *)&local_b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_b79);
  local_b58 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bc8,"--port",&local_bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bf0,"Port",&local_bf1);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_bc8,&statsdPort,&local_bf0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  pAVar4 = local_b58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c18,"--host",&local_c19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c40,"Hostname",(allocator *)((long)&broadcastServerApp + 7));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_c18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
             &local_c40);
  std::__cxx11::string::~string((string *)&local_c40);
  std::allocator<char>::~allocator((allocator<char> *)((long)&broadcastServerApp + 7));
  std::__cxx11::string::~string((string *)&local_c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_c19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c70,"broadcast_server",&local_c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c98,"Broadcasting server",&local_c99);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_c70,&local_c98);
  std::__cxx11::string::~string((string *)&local_c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_c99);
  std::__cxx11::string::~string((string *)&local_c70);
  std::allocator<char>::~allocator((allocator<char> *)&local_c71);
  local_c50 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_cc0,"--port",&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ce8,"Port",&local_ce9);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_cc0,&statsdPort,&local_ce8);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
  std::__cxx11::string::~string((string *)&local_cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
  pAVar4 = local_c50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d10,"--host",&local_d11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d38,"Hostname",(allocator *)((long)&pingPongApp + 7));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_d10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
             &local_d38);
  std::__cxx11::string::~string((string *)&local_d38);
  std::allocator<char>::~allocator((allocator<char> *)((long)&pingPongApp + 7));
  std::__cxx11::string::~string((string *)&local_d10);
  std::allocator<char>::~allocator((allocator<char> *)&local_d11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d68,"ping",&local_d69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d90,"Ping pong",&local_d91);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_d68,&local_d90);
  std::__cxx11::string::~string((string *)&local_d90);
  std::allocator<char>::~allocator((allocator<char> *)&local_d91);
  std::__cxx11::string::~string((string *)&local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  local_d48 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_db8,"url",&local_db9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_de0,"Connection url",(allocator *)((long)&httpClientApp + 7));
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_db8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8
                      ,&local_de0);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_de0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&httpClientApp + 7));
  std::__cxx11::string::~string((string *)&local_db8);
  std::allocator<char>::~allocator((allocator<char> *)&local_db9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e10,"curl",&local_e11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e38,"HTTP Client",&local_e39);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_e10,&local_e38);
  std::__cxx11::string::~string((string *)&local_e38);
  std::allocator<char>::~allocator((allocator<char> *)&local_e39);
  std::__cxx11::string::~string((string *)&local_e10);
  std::allocator<char>::~allocator((allocator<char> *)&local_e11);
  local_df0 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e60,"url",&local_e61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e88,"Connection url",&local_e89);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_e60,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8
                      ,&local_e88);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_e88);
  std::allocator<char>::~allocator((allocator<char> *)&local_e89);
  std::__cxx11::string::~string((string *)&local_e60);
  std::allocator<char>::~allocator((allocator<char> *)&local_e61);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_eb0,"-d",&local_eb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ed8,"Form data",&local_ed9);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_eb0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&headers.field_2 + 8),&local_ed8);
  CLI::OptionBase<CLI::Option>::join(&pOVar5->super_OptionBase<CLI::Option>);
  std::__cxx11::string::~string((string *)&local_ed8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed9);
  std::__cxx11::string::~string((string *)&local_eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f00,"-F",&local_f01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f28,"Form data",&local_f29);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_f00,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&headers.field_2 + 8),&local_f28);
  CLI::OptionBase<CLI::Option>::join(&pOVar5->super_OptionBase<CLI::Option>);
  std::__cxx11::string::~string((string *)&local_f28);
  std::allocator<char>::~allocator((allocator<char> *)&local_f29);
  std::__cxx11::string::~string((string *)&local_f00);
  std::allocator<char>::~allocator((allocator<char> *)&local_f01);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f50,"-H",&local_f51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f78,"Header",&local_f79);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_f50,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&output.field_2 + 8),&local_f78);
  CLI::OptionBase<CLI::Option>::join(&pOVar5->super_OptionBase<CLI::Option>);
  std::__cxx11::string::~string((string *)&local_f78);
  std::allocator<char>::~allocator((allocator<char> *)&local_f79);
  std::__cxx11::string::~string((string *)&local_f50);
  std::allocator<char>::~allocator((allocator<char> *)&local_f51);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fa0,"--output",&local_fa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fc8,"Output file",&local_fc9);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_fa0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&hostname.field_2 + 8),&local_fc8);
  std::__cxx11::string::~string((string *)&local_fc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fc9);
  std::__cxx11::string::~string((string *)&local_fa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ff0,"-I",&local_ff1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1018,"Send a HEAD request",&local_1019);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_ff0,&local_55a,&local_1018);
  std::__cxx11::string::~string((string *)&local_1018);
  std::allocator<char>::~allocator((allocator<char> *)&local_1019);
  std::__cxx11::string::~string((string *)&local_ff0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1040,"-L",&local_1041);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1068,"Follow redirects",&local_1069);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_1040,&local_55b,&local_1068);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator((allocator<char> *)&local_1069);
  std::__cxx11::string::~string((string *)&local_1040);
  std::allocator<char>::~allocator((allocator<char> *)&local_1041);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1090,"--max-redirects",&local_1091);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10b8,"Max Redirects",&local_10b9);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_1090,&count,&local_10b8);
  std::__cxx11::string::~string((string *)&local_10b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10b9);
  std::__cxx11::string::~string((string *)&local_1090);
  std::allocator<char>::~allocator((allocator<char> *)&local_1091);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10e0,"-v",&local_10e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1108,"Verbose",&local_1109);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_10e0,&local_55c,&local_1108);
  std::__cxx11::string::~string((string *)&local_1108);
  std::allocator<char>::~allocator((allocator<char> *)&local_1109);
  std::__cxx11::string::~string((string *)&local_10e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e1);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1130,"-O",&local_1131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1158,"Save output to disk",&local_1159);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_1130,(bool *)((long)&port + 3),&local_1158);
  std::__cxx11::string::~string((string *)&local_1158);
  std::allocator<char>::~allocator((allocator<char> *)&local_1159);
  std::__cxx11::string::~string((string *)&local_1130);
  std::allocator<char>::~allocator((allocator<char> *)&local_1131);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1180,"--compress",&local_1181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_11a8,"Enable gzip compression",&local_11a9);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_1180,(bool *)((long)&port + 2),&local_11a8);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11a9);
  std::__cxx11::string::~string((string *)&local_1180);
  std::allocator<char>::~allocator((allocator<char> *)&local_1181);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_11d0,"--connect-timeout",&local_11d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_11f8,"Connection timeout",&local_11f9);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_11d0,&maxRedirects,&local_11f8);
  std::__cxx11::string::~string((string *)&local_11f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11f9);
  std::__cxx11::string::~string((string *)&local_11d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11d1);
  pAVar4 = local_df0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1220,"--transfer-timeout",&local_1221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1248,"Transfer timeout",(allocator *)((long)&redisPublishApp + 7));
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_1220,&delayMs,&local_1248);
  std::__cxx11::string::~string((string *)&local_1248);
  std::allocator<char>::~allocator((allocator<char> *)((long)&redisPublishApp + 7));
  std::__cxx11::string::~string((string *)&local_1220);
  std::allocator<char>::~allocator((allocator<char> *)&local_1221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1278,"redis_publish",&local_1279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_12a0,"Redis publisher",&local_12a1);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_1278,&local_12a0);
  std::__cxx11::string::~string((string *)&local_12a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12a1);
  std::__cxx11::string::~string((string *)&local_1278);
  std::allocator<char>::~allocator((allocator<char> *)&local_1279);
  local_1258 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_12c8,"--port",&local_12c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_12f0,"Port",&local_12f1);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_12c8,&connectTimeOut,&local_12f0)
  ;
  std::__cxx11::string::~string((string *)&local_12f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12f1);
  std::__cxx11::string::~string((string *)&local_12c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12c9);
  pAVar4 = local_1258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1318,"--host",&local_1319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1340,"Hostname",&local_1341);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1318,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
             &local_1340);
  std::__cxx11::string::~string((string *)&local_1340);
  std::allocator<char>::~allocator((allocator<char> *)&local_1341);
  std::__cxx11::string::~string((string *)&local_1318);
  std::allocator<char>::~allocator((allocator<char> *)&local_1319);
  pAVar4 = local_1258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1368,"--password",&local_1369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1390,"Password",&local_1391);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1368,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&appkey.field_2 + 8),&local_1390);
  std::__cxx11::string::~string((string *)&local_1390);
  std::allocator<char>::~allocator((allocator<char> *)&local_1391);
  std::__cxx11::string::~string((string *)&local_1368);
  std::allocator<char>::~allocator((allocator<char> *)&local_1369);
  pAVar4 = local_1258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13b8,"channel",&local_13b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13e0,"Channel",&local_13e1);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_13b8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&message.field_2 + 8),&local_13e0);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_13e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13e1);
  std::__cxx11::string::~string((string *)&local_13b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13b9);
  pAVar4 = local_1258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1408,"message",&local_1409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1430,"Message",&local_1431);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1408,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&password.field_2 + 8),&local_1430);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_1430);
  std::allocator<char>::~allocator((allocator<char> *)&local_1431);
  std::__cxx11::string::~string((string *)&local_1408);
  std::allocator<char>::~allocator((allocator<char> *)&local_1409);
  pAVar4 = local_1258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1458,"-c",&local_1459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1480,"Count",(allocator *)((long)&redisSubscribeApp + 7));
  CLI::App::add_option<int,_(CLI::detail::enabler)0>
            (pAVar4,&local_1458,(int *)((long)&sendApp + 4),&local_1480);
  std::__cxx11::string::~string((string *)&local_1480);
  std::allocator<char>::~allocator((allocator<char> *)((long)&redisSubscribeApp + 7));
  std::__cxx11::string::~string((string *)&local_1458);
  std::allocator<char>::~allocator((allocator<char> *)&local_1459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14b0,"redis_subscribe",&local_14b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14d8,"Redis subscriber",&local_14d9);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_14b0,&local_14d8);
  std::__cxx11::string::~string((string *)&local_14d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14d9);
  std::__cxx11::string::~string((string *)&local_14b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b1);
  local_1490 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1500,"--port",&local_1501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1528,"Port",&local_1529);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_1500,&connectTimeOut,&local_1528)
  ;
  std::__cxx11::string::~string((string *)&local_1528);
  std::allocator<char>::~allocator((allocator<char> *)&local_1529);
  std::__cxx11::string::~string((string *)&local_1500);
  std::allocator<char>::~allocator((allocator<char> *)&local_1501);
  pAVar4 = local_1490;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1550,"--host",&local_1551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1578,"Hostname",&local_1579);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1550,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
             &local_1578);
  std::__cxx11::string::~string((string *)&local_1578);
  std::allocator<char>::~allocator((allocator<char> *)&local_1579);
  std::__cxx11::string::~string((string *)&local_1550);
  std::allocator<char>::~allocator((allocator<char> *)&local_1551);
  pAVar4 = local_1490;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_15a0,"--password",&local_15a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_15c8,"Password",&local_15c9);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_15a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&appkey.field_2 + 8),&local_15c8);
  std::__cxx11::string::~string((string *)&local_15c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15c9);
  std::__cxx11::string::~string((string *)&local_15a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15a1);
  pAVar4 = local_1490;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_15f0,"channel",&local_15f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1618,"Channel",&local_1619);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_15f0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&message.field_2 + 8),&local_1618);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_1618);
  std::allocator<char>::~allocator((allocator<char> *)&local_1619);
  std::__cxx11::string::~string((string *)&local_15f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15f1);
  pAVar4 = local_1490;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1640,"-v",&local_1641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1668,"Verbose",&local_1669);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_1640,&local_55c,&local_1668);
  std::__cxx11::string::~string((string *)&local_1668);
  std::allocator<char>::~allocator((allocator<char> *)&local_1669);
  std::__cxx11::string::~string((string *)&local_1640);
  std::allocator<char>::~allocator((allocator<char> *)&local_1641);
  pAVar4 = local_1490;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1690,"--pidfile",&local_1691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_16b8,"Pid file",(allocator *)((long)&cobraSubscribeApp + 7));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1690,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&channel.field_2 + 8),&local_16b8);
  std::__cxx11::string::~string((string *)&local_16b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cobraSubscribeApp + 7));
  std::__cxx11::string::~string((string *)&local_1690);
  std::allocator<char>::~allocator((allocator<char> *)&local_1691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_16e8,"cobra_subscribe",&local_16e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1710,"Cobra subscriber",&local_1711);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_16e8,&local_1710);
  std::__cxx11::string::~string((string *)&local_1710);
  std::allocator<char>::~allocator((allocator<char> *)&local_1711);
  std::__cxx11::string::~string((string *)&local_16e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16e9);
  local_16c8 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1738,"--appkey",&local_1739);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1760,"Appkey",&local_1761);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1738,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&endpoint.field_2 + 8),&local_1760);
  std::__cxx11::string::~string((string *)&local_1760);
  std::allocator<char>::~allocator((allocator<char> *)&local_1761);
  std::__cxx11::string::~string((string *)&local_1738);
  std::allocator<char>::~allocator((allocator<char> *)&local_1739);
  pAVar4 = local_16c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1788,"--endpoint",&local_1789);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_17b0,"Endpoint",&local_17b1);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rolename.field_2 + 8),&local_17b0);
  std::__cxx11::string::~string((string *)&local_17b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17b1);
  std::__cxx11::string::~string((string *)&local_1788);
  std::allocator<char>::~allocator((allocator<char> *)&local_1789);
  pAVar4 = local_16c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_17d8,"--rolename",&local_17d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1800,"Role name",&local_1801);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_17d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rolesecret.field_2 + 8),&local_1800);
  std::__cxx11::string::~string((string *)&local_1800);
  std::allocator<char>::~allocator((allocator<char> *)&local_1801);
  std::__cxx11::string::~string((string *)&local_17d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_17d9);
  pAVar4 = local_16c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1828,"--rolesecret",&local_1829);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1850,"Role secret",&local_1851);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1828,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&prefix.field_2 + 8),&local_1850);
  std::__cxx11::string::~string((string *)&local_1850);
  std::allocator<char>::~allocator((allocator<char> *)&local_1851);
  std::__cxx11::string::~string((string *)&local_1828);
  std::allocator<char>::~allocator((allocator<char> *)&local_1829);
  pAVar4 = local_16c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1878,"channel",&local_1879);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_18a0,"Channel",&local_18a1);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1878,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&message.field_2 + 8),&local_18a0);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_18a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_18a1);
  std::__cxx11::string::~string((string *)&local_1878);
  std::allocator<char>::~allocator((allocator<char> *)&local_1879);
  pAVar4 = local_16c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_18c8,"--pidfile",&local_18c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_18f0,"Pid file",(allocator *)((long)&cobraPublish + 7));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_18c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&channel.field_2 + 8),&local_18f0);
  std::__cxx11::string::~string((string *)&local_18f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cobraPublish + 7));
  std::__cxx11::string::~string((string *)&local_18c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_18c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1920,"cobra_publish",&local_1921);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1948,"Cobra publisher",&local_1949);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_1920,&local_1948);
  std::__cxx11::string::~string((string *)&local_1948);
  std::allocator<char>::~allocator((allocator<char> *)&local_1949);
  std::__cxx11::string::~string((string *)&local_1920);
  std::allocator<char>::~allocator((allocator<char> *)&local_1921);
  local_1900 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1970,"--appkey",&local_1971);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1998,"Appkey",&local_1999);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1970,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&endpoint.field_2 + 8),&local_1998);
  std::__cxx11::string::~string((string *)&local_1998);
  std::allocator<char>::~allocator((allocator<char> *)&local_1999);
  std::__cxx11::string::~string((string *)&local_1970);
  std::allocator<char>::~allocator((allocator<char> *)&local_1971);
  pAVar4 = local_1900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_19c0,"--endpoint",&local_19c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_19e8,"Endpoint",&local_19e9);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_19c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rolename.field_2 + 8),&local_19e8);
  std::__cxx11::string::~string((string *)&local_19e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19e9);
  std::__cxx11::string::~string((string *)&local_19c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19c1);
  pAVar4 = local_1900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a10,"--rolename",&local_1a11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a38,"Role name",&local_1a39);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1a10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rolesecret.field_2 + 8),&local_1a38);
  std::__cxx11::string::~string((string *)&local_1a38);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a39);
  std::__cxx11::string::~string((string *)&local_1a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a11);
  pAVar4 = local_1900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a60,"--rolesecret",&local_1a61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a88,"Role secret",&local_1a89);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1a60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&prefix.field_2 + 8),&local_1a88);
  std::__cxx11::string::~string((string *)&local_1a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a89);
  std::__cxx11::string::~string((string *)&local_1a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a61);
  pAVar4 = local_1900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ab0,"channel",&local_1ab1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ad8,"Channel",&local_1ad9);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1ab0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&message.field_2 + 8),&local_1ad8);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_1ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ad9);
  std::__cxx11::string::~string((string *)&local_1ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ab1);
  pAVar4 = local_1900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b00,"--pidfile",&local_1b01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b28,"Pid file",&local_1b29);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1b00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&channel.field_2 + 8),&local_1b28);
  std::__cxx11::string::~string((string *)&local_1b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b29);
  std::__cxx11::string::~string((string *)&local_1b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b01);
  pAVar4 = local_1900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b50,"path",&local_1b51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b78,"Path to the file to send",&local_1b79);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1b50,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&user.field_2 + 8),&local_1b78);
  pOVar5 = CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  CLI::Option::check(pOVar5,(Validator *)CLI::ExistingPath);
  std::__cxx11::string::~string((string *)&local_1b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b79);
  std::__cxx11::string::~string((string *)&local_1b50);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b51);
  pAVar4 = local_1900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ba0,"--stress",&local_1ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1bc8,"Stress mode",(allocator *)((long)&cobra2statsd + 7));
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_1ba0,(bool *)&port,&local_1bc8);
  std::__cxx11::string::~string((string *)&local_1bc8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cobra2statsd + 7));
  std::__cxx11::string::~string((string *)&local_1ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1bf8,"cobra_to_statsd",&local_1bf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c20,"Cobra to statsd",&local_1c21);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_1bf8,&local_1c20);
  std::__cxx11::string::~string((string *)&local_1c20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c21);
  std::__cxx11::string::~string((string *)&local_1bf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bf9);
  local_1bd8 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c48,"--appkey",&local_1c49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c70,"Appkey",&local_1c71);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1c48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&endpoint.field_2 + 8),&local_1c70);
  std::__cxx11::string::~string((string *)&local_1c70);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c71);
  std::__cxx11::string::~string((string *)&local_1c48);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c49);
  pAVar4 = local_1bd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c98,"--endpoint",&local_1c99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1cc0,"Endpoint",&local_1cc1);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1c98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rolename.field_2 + 8),&local_1cc0);
  std::__cxx11::string::~string((string *)&local_1cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cc1);
  std::__cxx11::string::~string((string *)&local_1c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c99);
  pAVar4 = local_1bd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ce8,"--rolename",&local_1ce9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d10,"Role name",&local_1d11);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1ce8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rolesecret.field_2 + 8),&local_1d10);
  std::__cxx11::string::~string((string *)&local_1d10);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d11);
  std::__cxx11::string::~string((string *)&local_1ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ce9);
  pAVar4 = local_1bd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d38,"--rolesecret",&local_1d39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d60,"Role secret",&local_1d61);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1d38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&prefix.field_2 + 8),&local_1d60);
  std::__cxx11::string::~string((string *)&local_1d60);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d61);
  std::__cxx11::string::~string((string *)&local_1d38);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d39);
  pAVar4 = local_1bd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d88,"--host",&local_1d89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1db0,"Statsd host",&local_1db1);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1d88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
             &local_1db0);
  std::__cxx11::string::~string((string *)&local_1db0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1db1);
  std::__cxx11::string::~string((string *)&local_1d88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d89);
  pAVar4 = local_1bd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1dd8,"--port",&local_1dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e00,"Statsd port",&local_1e01);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>
            (pAVar4,&local_1dd8,&transferTimeout,&local_1e00);
  std::__cxx11::string::~string((string *)&local_1e00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e01);
  std::__cxx11::string::~string((string *)&local_1dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1dd9);
  pAVar4 = local_1bd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e28,"--prefix",&local_1e29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e50,"Statsd prefix",&local_1e51);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1e28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8,
             &local_1e50);
  std::__cxx11::string::~string((string *)&local_1e50);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e51);
  std::__cxx11::string::~string((string *)&local_1e28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e29);
  pAVar4 = local_1bd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e78,"--fields",&local_1e79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1ea0,"Extract fields for naming the event",&local_1ea1);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1e78,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&dsn.field_2 + 8),&local_1ea0);
  CLI::OptionBase<CLI::Option>::join(&pOVar5->super_OptionBase<CLI::Option>);
  std::__cxx11::string::~string((string *)&local_1ea0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ea1);
  std::__cxx11::string::~string((string *)&local_1e78);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e79);
  pAVar4 = local_1bd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ec8,"channel",&local_1ec9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ef0,"Channel",&local_1ef1);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1ec8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&message.field_2 + 8),&local_1ef0);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_1ef0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ef1);
  std::__cxx11::string::~string((string *)&local_1ec8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ec9);
  pAVar4 = local_1bd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f18,"-v",&local_1f19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f40,"Verbose",&local_1f41);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_1f18,&local_55c,&local_1f40);
  std::__cxx11::string::~string((string *)&local_1f40);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f41);
  std::__cxx11::string::~string((string *)&local_1f18);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f19);
  pAVar4 = local_1bd8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f68,"--pidfile",&local_1f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f90,"Pid file",(allocator *)((long)&cobra2sentry + 7));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1f68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&channel.field_2 + 8),&local_1f90);
  std::__cxx11::string::~string((string *)&local_1f90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cobra2sentry + 7));
  std::__cxx11::string::~string((string *)&local_1f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1fc0,"cobra_to_sentry",&local_1fc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1fe8,"Cobra to sentry",&local_1fe9);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_1fc0,&local_1fe8);
  std::__cxx11::string::~string((string *)&local_1fe8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fe9);
  std::__cxx11::string::~string((string *)&local_1fc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fc1);
  local_1fa0 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2010,"--appkey",&local_2011);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2038,"Appkey",&local_2039);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_2010,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&endpoint.field_2 + 8),&local_2038);
  std::__cxx11::string::~string((string *)&local_2038);
  std::allocator<char>::~allocator((allocator<char> *)&local_2039);
  std::__cxx11::string::~string((string *)&local_2010);
  std::allocator<char>::~allocator((allocator<char> *)&local_2011);
  pAVar4 = local_1fa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2060,"--endpoint",&local_2061);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2088,"Endpoint",&local_2089);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_2060,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rolename.field_2 + 8),&local_2088);
  std::__cxx11::string::~string((string *)&local_2088);
  std::allocator<char>::~allocator((allocator<char> *)&local_2089);
  std::__cxx11::string::~string((string *)&local_2060);
  std::allocator<char>::~allocator((allocator<char> *)&local_2061);
  pAVar4 = local_1fa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_20b0,"--rolename",&local_20b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_20d8,"Role name",&local_20d9);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_20b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rolesecret.field_2 + 8),&local_20d8);
  std::__cxx11::string::~string((string *)&local_20d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_20d9);
  std::__cxx11::string::~string((string *)&local_20b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_20b1);
  pAVar4 = local_1fa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2100,"--rolesecret",&local_2101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2128,"Role secret",&local_2129);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_2100,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&prefix.field_2 + 8),&local_2128);
  std::__cxx11::string::~string((string *)&local_2128);
  std::allocator<char>::~allocator((allocator<char> *)&local_2129);
  std::__cxx11::string::~string((string *)&local_2100);
  std::allocator<char>::~allocator((allocator<char> *)&local_2101);
  pAVar4 = local_1fa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2150,"--dsn",&local_2151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2178,"Sentry DSN",&local_2179);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_2150,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&redisHosts.field_2 + 8),&local_2178);
  std::__cxx11::string::~string((string *)&local_2178);
  std::allocator<char>::~allocator((allocator<char> *)&local_2179);
  std::__cxx11::string::~string((string *)&local_2150);
  std::allocator<char>::~allocator((allocator<char> *)&local_2151);
  pAVar4 = local_1fa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_21a0,"--jobs",&local_21a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_21c8,"Number of thread sending events to Sentry",&local_21c9);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_21a0,(int *)&sendApp,&local_21c8)
  ;
  std::__cxx11::string::~string((string *)&local_21c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_21c9);
  std::__cxx11::string::~string((string *)&local_21a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_21a1);
  pAVar4 = local_1fa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_21f0,"channel",&local_21f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2218,"Channel",&local_2219);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_21f0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&message.field_2 + 8),&local_2218);
  CLI::OptionBase<CLI::Option>::required(&pOVar5->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_2218);
  std::allocator<char>::~allocator((allocator<char> *)&local_2219);
  std::__cxx11::string::~string((string *)&local_21f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_21f1);
  pAVar4 = local_1fa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2240,"-v",&local_2241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2268,"Verbose",&local_2269);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_2240,&local_55c,&local_2268);
  std::__cxx11::string::~string((string *)&local_2268);
  std::allocator<char>::~allocator((allocator<char> *)&local_2269);
  std::__cxx11::string::~string((string *)&local_2240);
  std::allocator<char>::~allocator((allocator<char> *)&local_2241);
  pAVar4 = local_1fa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2290,"-s",&local_2291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_22b8,"Strict mode. Error out when sending to sentry fails",&local_22b9
            );
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_2290,(bool *)((long)&port + 1),&local_22b8);
  std::__cxx11::string::~string((string *)&local_22b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_22b9);
  std::__cxx11::string::~string((string *)&local_2290);
  std::allocator<char>::~allocator((allocator<char> *)&local_2291);
  pAVar4 = local_1fa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_22e0,"--pidfile",&local_22e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2308,"Pid file",(allocator *)((long)&runApp + 7));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_22e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&channel.field_2 + 8),&local_2308);
  std::__cxx11::string::~string((string *)&local_2308);
  std::allocator<char>::~allocator((allocator<char> *)((long)&runApp + 7));
  std::__cxx11::string::~string((string *)&local_22e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_22e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2338,"snake",&local_2339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2360,"Snake server",&local_2361);
  pAVar4 = CLI::App::add_subcommand((App *)local_248,&local_2338,&local_2360);
  std::__cxx11::string::~string((string *)&local_2360);
  std::allocator<char>::~allocator((allocator<char> *)&local_2361);
  std::__cxx11::string::~string((string *)&local_2338);
  std::allocator<char>::~allocator((allocator<char> *)&local_2339);
  local_2318 = pAVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2388,"--port",&local_2389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_23b0,"Connection url",&local_23b1);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_2388,&statsdPort,&local_23b0);
  std::__cxx11::string::~string((string *)&local_23b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_23b1);
  std::__cxx11::string::~string((string *)&local_2388);
  std::allocator<char>::~allocator((allocator<char> *)&local_2389);
  pAVar4 = local_2318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_23d8,"--host",&local_23d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2400,"Hostname",&local_2401);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_23d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
             &local_2400);
  std::__cxx11::string::~string((string *)&local_2400);
  std::allocator<char>::~allocator((allocator<char> *)&local_2401);
  std::__cxx11::string::~string((string *)&local_23d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_23d9);
  pAVar4 = local_2318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2428,"--pidfile",&local_2429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2450,"Pid file",&local_2451);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_2428,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&channel.field_2 + 8),&local_2450);
  std::__cxx11::string::~string((string *)&local_2450);
  std::allocator<char>::~allocator((allocator<char> *)&local_2451);
  std::__cxx11::string::~string((string *)&local_2428);
  std::allocator<char>::~allocator((allocator<char> *)&local_2429);
  pAVar4 = local_2318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2478,"--redis_hosts",&local_2479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_24a0,"Redis hosts",&local_24a1);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_2478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510,
             &local_24a0);
  std::__cxx11::string::~string((string *)&local_24a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_24a1);
  std::__cxx11::string::~string((string *)&local_2478);
  std::allocator<char>::~allocator((allocator<char> *)&local_2479);
  pAVar4 = local_2318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_24c8,"--redis_port",&local_24c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_24f0,"Redis hosts",&local_24f1);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_24c8,&connectTimeOut,&local_24f0)
  ;
  std::__cxx11::string::~string((string *)&local_24f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_24f1);
  std::__cxx11::string::~string((string *)&local_24c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_24c9);
  pAVar4 = local_2318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2518,"--redis_password",&local_2519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2540,"Redis password",&local_2541);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_2518,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&appsConfigPath.field_2 + 8),&local_2540);
  std::__cxx11::string::~string((string *)&local_2540);
  std::allocator<char>::~allocator((allocator<char> *)&local_2541);
  std::__cxx11::string::~string((string *)&local_2518);
  std::allocator<char>::~allocator((allocator<char> *)&local_2519);
  pAVar4 = local_2318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2568,"--apps_config_path",&local_2569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2590,"Path to auth data",&local_2591);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_2568,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stress,
                      &local_2590);
  CLI::Option::check(pOVar5,(Validator *)CLI::ExistingPath);
  std::__cxx11::string::~string((string *)&local_2590);
  std::allocator<char>::~allocator((allocator<char> *)&local_2591);
  std::__cxx11::string::~string((string *)&local_2568);
  std::allocator<char>::~allocator((allocator<char> *)&local_2569);
  pAVar4 = local_2318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_25b8,"-v",&local_25b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_25e0,"Verbose",(allocator *)((long)&e + 7));
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_25b8,&local_55c,&local_25e0);
  std::__cxx11::string::~string((string *)&local_25e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_25b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_25b9);
  CLI::App::parse((App *)local_248,argc,(char **)logFunc._M_invoker);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    __name = (char *)std::__cxx11::string::c_str();
    unlink(__name);
    std::ofstream::ofstream(local_27f8);
    std::ofstream::open(local_27f8,(int)&channel + (_S_out|_S_in));
    _Var3 = getpid();
    std::ostream::operator<<(local_27f8,_Var3);
    std::ofstream::close();
    std::ofstream::~ofstream(local_27f8);
  }
  local_27fc = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2820,"transfer",&local_2821);
  bVar2 = CLI::App::got_subcommand((App *)local_248,&local_2820);
  std::__cxx11::string::~string((string *)&local_2820);
  std::allocator<char>::~allocator((allocator<char> *)&local_2821);
  if (bVar2) {
    local_27fc = ix::ws_transfer_main(statsdPort,(string *)local_380);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2848,"send",&local_2849);
    bVar2 = CLI::App::got_subcommand((App *)local_248,&local_2848);
    std::__cxx11::string::~string((string *)&local_2848);
    std::allocator<char>::~allocator((allocator<char> *)&local_2849);
    if (bVar2) {
      local_27fc = ix::ws_send_main((string *)local_2b8,(string *)((long)&user.field_2 + 8));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_2870,"receive",&local_2871);
      bVar2 = CLI::App::got_subcommand((App *)local_248,(string *)local_2870);
      std::__cxx11::string::~string((string *)local_2870);
      std::allocator<char>::~allocator((allocator<char> *)&local_2871);
      if (bVar2) {
        local_2872 = 0;
        local_27fc = ix::ws_receive_main((string *)local_2b8,false,jobs);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2898,"connect",&local_2899);
        bVar2 = CLI::App::got_subcommand((App *)local_248,&local_2898);
        std::__cxx11::string::~string((string *)&local_2898);
        std::allocator<char>::~allocator((allocator<char> *)&local_2899);
        if (bVar2) {
          local_27fc = ix::ws_connect_main((string *)local_2b8,(bool)(redisPort._3_1_ & 1));
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_28c0,"chat",&local_28c1);
          bVar2 = CLI::App::got_subcommand((App *)local_248,&local_28c0);
          std::__cxx11::string::~string((string *)&local_28c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_28c1);
          if (bVar2) {
            local_27fc = ix::ws_chat_main((string *)local_2b8,(string *)((long)&data.field_2 + 8));
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_28e8,"echo_server",&local_28e9);
            bVar2 = CLI::App::got_subcommand((App *)local_248,&local_28e8);
            std::__cxx11::string::~string((string *)&local_28e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_28e9);
            if (bVar2) {
              local_27fc = ix::ws_echo_server_main(statsdPort,(string *)local_380);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_2910,"broadcast_server",&local_2911);
              bVar2 = CLI::App::got_subcommand((App *)local_248,&local_2910);
              std::__cxx11::string::~string((string *)&local_2910);
              std::allocator<char>::~allocator((allocator<char> *)&local_2911);
              if (bVar2) {
                local_27fc = ix::ws_broadcast_server_main(statsdPort,(string *)local_380);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_2938,"ping",&local_2939);
                bVar2 = CLI::App::got_subcommand((App *)local_248,&local_2938);
                std::__cxx11::string::~string((string *)&local_2938);
                std::allocator<char>::~allocator((allocator<char> *)&local_2939);
                if (bVar2) {
                  local_27fc = ix::ws_ping_pong_main((string *)local_2b8);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_2960,"curl",&local_2961);
                  bVar2 = CLI::App::got_subcommand((App *)local_248,&local_2960);
                  std::__cxx11::string::~string((string *)&local_2960);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2961);
                  if (bVar2) {
                    local_27fc = ix::ws_http_client_main
                                           ((string *)local_2b8,
                                            (string *)((long)&output.field_2 + 8),
                                            (string *)((long)&headers.field_2 + 8),
                                            (bool)(local_55a & 1),maxRedirects,delayMs,
                                            (bool)(local_55b & 1),count,(bool)(local_55c & 1),
                                            (bool)(port._3_1_ & 1),
                                            (string *)((long)&hostname.field_2 + 8),
                                            (bool)(port._2_1_ & 1));
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_2988,"redis_publish",&local_2989);
                    bVar2 = CLI::App::got_subcommand((App *)local_248,&local_2988);
                    std::__cxx11::string::~string((string *)&local_2988);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2989);
                    if (bVar2) {
                      local_27fc = ix::ws_redis_publish_main
                                             ((string *)local_380,connectTimeOut,
                                              (string *)((long)&appkey.field_2 + 8),
                                              (string *)((long)&message.field_2 + 8),
                                              (string *)((long)&password.field_2 + 8),sendApp._4_4_)
                      ;
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_29b0,"redis_subscribe",&local_29b1);
                      bVar2 = CLI::App::got_subcommand((App *)local_248,&local_29b0);
                      std::__cxx11::string::~string((string *)&local_29b0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_29b1);
                      if (bVar2) {
                        local_27fc = ix::ws_redis_subscribe_main
                                               ((string *)local_380,connectTimeOut,
                                                (string *)((long)&appkey.field_2 + 8),
                                                (string *)((long)&message.field_2 + 8),
                                                (bool)(local_55c & 1));
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_29d8,"cobra_subscribe",&local_29d9);
                        bVar2 = CLI::App::got_subcommand((App *)local_248,&local_29d8);
                        std::__cxx11::string::~string((string *)&local_29d8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_29d9);
                        if (bVar2) {
                          local_27fc = ix::ws_cobra_subscribe_main
                                                 ((string *)((long)&endpoint.field_2 + 8),
                                                  (string *)((long)&rolename.field_2 + 8),
                                                  (string *)((long)&rolesecret.field_2 + 8),
                                                  (string *)((long)&prefix.field_2 + 8),
                                                  (string *)((long)&message.field_2 + 8));
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)&local_2a00,"cobra_publish",&local_2a01);
                          bVar2 = CLI::App::got_subcommand((App *)local_248,&local_2a00);
                          std::__cxx11::string::~string((string *)&local_2a00);
                          std::allocator<char>::~allocator((allocator<char> *)&local_2a01);
                          if (bVar2) {
                            local_27fc = ix::ws_cobra_publish_main
                                                   ((string *)((long)&endpoint.field_2 + 8),
                                                    (string *)((long)&rolename.field_2 + 8),
                                                    (string *)((long)&rolesecret.field_2 + 8),
                                                    (string *)((long)&prefix.field_2 + 8),
                                                    (string *)((long)&message.field_2 + 8),
                                                    (string *)((long)&user.field_2 + 8),
                                                    (bool)((byte)port & 1));
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)&local_2a28,"cobra_to_statsd",&local_2a29);
                            bVar2 = CLI::App::got_subcommand((App *)local_248,&local_2a28);
                            std::__cxx11::string::~string((string *)&local_2a28);
                            std::allocator<char>::~allocator((allocator<char> *)&local_2a29);
                            if (bVar2) {
                              local_27fc = ix::ws_cobra_to_statsd_main
                                                     ((string *)((long)&endpoint.field_2 + 8),
                                                      (string *)((long)&rolename.field_2 + 8),
                                                      (string *)((long)&rolesecret.field_2 + 8),
                                                      (string *)((long)&prefix.field_2 + 8),
                                                      (string *)((long)&message.field_2 + 8),
                                                      (string *)local_380,transferTimeout,
                                                      (string *)local_4a8,
                                                      (string *)((long)&dsn.field_2 + 8),
                                                      (bool)(local_55c & 1));
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)&local_2a50,"cobra_to_sentry",&local_2a51);
                              bVar2 = CLI::App::got_subcommand((App *)local_248,&local_2a50);
                              std::__cxx11::string::~string((string *)&local_2a50);
                              std::allocator<char>::~allocator((allocator<char> *)&local_2a51);
                              if (bVar2) {
                                local_27fc = ix::ws_cobra_to_sentry_main
                                                       ((string *)((long)&endpoint.field_2 + 8),
                                                        (string *)((long)&rolename.field_2 + 8),
                                                        (string *)((long)&rolesecret.field_2 + 8),
                                                        (string *)((long)&prefix.field_2 + 8),
                                                        (string *)((long)&message.field_2 + 8),
                                                        (string *)((long)&redisHosts.field_2 + 8),
                                                        (bool)(local_55c & 1),(bool)(port._1_1_ & 1)
                                                        ,(int)sendApp);
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)&local_2a78,"snake",&local_2a79);
                                bVar2 = CLI::App::got_subcommand((App *)local_248,&local_2a78);
                                std::__cxx11::string::~string((string *)&local_2a78);
                                std::allocator<char>::~allocator((allocator<char> *)&local_2a79);
                                if (bVar2) {
                                  local_27fc = ix::ws_snake_main(statsdPort,(string *)local_380,
                                                                 (string *)local_510,connectTimeOut,
                                                                 (string *)
                                                                 ((long)&appsConfigPath.field_2 + 8)
                                                                 ,(bool)(local_55c & 1),
                                                                 (string *)&stress);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ix::uninitNetSystem();
  iVar1 = local_27fc;
  std::__cxx11::string::~string((string *)&stress);
  std::__cxx11::string::~string((string *)(appsConfigPath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_510);
  std::__cxx11::string::~string((string *)(redisHosts.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(dsn.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_4a8);
  std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(rolesecret.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(rolename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(endpoint.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(appkey.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(password.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(channel.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_380);
  std::__cxx11::string::~string((string *)(hostname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(headers.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(data.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(user.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_2b8);
  CLI::App::~App((App *)local_248);
  std::function<void_(const_char_*)>::~function((function<void_(const_char_*)> *)local_38);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    ix::initNetSystem();

    ix::IXCoreLogger::LogFunc logFunc = [](const char* msg)
    {
        std::cout << msg << std::endl;
    };
    ix::IXCoreLogger::setLogFunction(logFunc);

    CLI::App app{"ws is a websocket tool"};
    app.require_subcommand();

    std::string url("ws://127.0.0.1:8008");
    std::string path;
    std::string user;
    std::string data;
    std::string headers;
    std::string output;
    std::string hostname("127.0.0.1");
    std::string pidfile;
    std::string channel;
    std::string message;
    std::string password;
    std::string appkey;
    std::string endpoint;
    std::string rolename;
    std::string rolesecret;
    std::string prefix("ws.test.v0");
    std::string fields;
    std::string dsn;
    std::string redisHosts("127.0.0.1");
    std::string redisPassword;
    std::string appsConfigPath("appsConfig.json");
    bool headersOnly = false;
    bool followRedirects = false;
    bool verbose = false;
    bool save = false;
    bool compress = false;
    bool strict = false;
    bool stress = false;
    bool disableAutomaticReconnection = false;
    int port = 8008;
    int redisPort = 6379;
    int statsdPort = 8125;
    int connectTimeOut = 60;
    int transferTimeout = 1800;
    int maxRedirects = 5;
    int delayMs = -1;
    int count = 1;
    int jobs = 4;

    CLI::App* sendApp = app.add_subcommand("send", "Send a file");
    sendApp->add_option("url", url, "Connection url")->required();
    sendApp->add_option("path", path, "Path to the file to send")
        ->required()->check(CLI::ExistingPath);
    sendApp->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* receiveApp = app.add_subcommand("receive", "Receive a file");
    receiveApp->add_option("url", url, "Connection url")->required();
    receiveApp->add_option("--delay", delayMs, "Delay (ms) to wait after receiving a fragment"
                                               " to artificially slow down the receiver");
    receiveApp->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* transferApp = app.add_subcommand("transfer", "Broadcasting server");
    transferApp->add_option("--port", port, "Connection url");
    transferApp->add_option("--host", hostname, "Hostname");
    transferApp->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* connectApp = app.add_subcommand("connect", "Connect to a remote server");
    connectApp->add_option("url", url, "Connection url")->required();
    connectApp->add_flag("-d", disableAutomaticReconnection, "Disable Automatic Reconnection");

    CLI::App* chatApp = app.add_subcommand("chat", "Group chat");
    chatApp->add_option("url", url, "Connection url")->required();
    chatApp->add_option("user", user, "User name")->required();

    CLI::App* echoServerApp = app.add_subcommand("echo_server", "Echo server");
    echoServerApp->add_option("--port", port, "Port");
    echoServerApp->add_option("--host", hostname, "Hostname");

    CLI::App* broadcastServerApp = app.add_subcommand("broadcast_server", "Broadcasting server");
    broadcastServerApp->add_option("--port", port, "Port");
    broadcastServerApp->add_option("--host", hostname, "Hostname");

    CLI::App* pingPongApp = app.add_subcommand("ping", "Ping pong");
    pingPongApp->add_option("url", url, "Connection url")->required();

    CLI::App* httpClientApp = app.add_subcommand("curl", "HTTP Client");
    httpClientApp->add_option("url", url, "Connection url")->required();
    httpClientApp->add_option("-d", data, "Form data")->join();
    httpClientApp->add_option("-F", data, "Form data")->join();
    httpClientApp->add_option("-H", headers, "Header")->join();
    httpClientApp->add_option("--output", output, "Output file");
    httpClientApp->add_flag("-I", headersOnly, "Send a HEAD request");
    httpClientApp->add_flag("-L", followRedirects, "Follow redirects");
    httpClientApp->add_option("--max-redirects", maxRedirects, "Max Redirects");
    httpClientApp->add_flag("-v", verbose, "Verbose");
    httpClientApp->add_flag("-O", save, "Save output to disk");
    httpClientApp->add_flag("--compress", compress, "Enable gzip compression");
    httpClientApp->add_option("--connect-timeout", connectTimeOut, "Connection timeout");
    httpClientApp->add_option("--transfer-timeout", transferTimeout, "Transfer timeout");

    CLI::App* redisPublishApp = app.add_subcommand("redis_publish", "Redis publisher");
    redisPublishApp->add_option("--port", redisPort, "Port");
    redisPublishApp->add_option("--host", hostname, "Hostname");
    redisPublishApp->add_option("--password", password, "Password");
    redisPublishApp->add_option("channel", channel, "Channel")->required();
    redisPublishApp->add_option("message", message, "Message")->required();
    redisPublishApp->add_option("-c", count, "Count");

    CLI::App* redisSubscribeApp = app.add_subcommand("redis_subscribe", "Redis subscriber");
    redisSubscribeApp->add_option("--port", redisPort, "Port");
    redisSubscribeApp->add_option("--host", hostname, "Hostname");
    redisSubscribeApp->add_option("--password", password, "Password");
    redisSubscribeApp->add_option("channel", channel, "Channel")->required();
    redisSubscribeApp->add_flag("-v", verbose, "Verbose");
    redisSubscribeApp->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* cobraSubscribeApp = app.add_subcommand("cobra_subscribe", "Cobra subscriber");
    cobraSubscribeApp->add_option("--appkey", appkey, "Appkey");
    cobraSubscribeApp->add_option("--endpoint", endpoint, "Endpoint");
    cobraSubscribeApp->add_option("--rolename", rolename, "Role name");
    cobraSubscribeApp->add_option("--rolesecret", rolesecret, "Role secret");
    cobraSubscribeApp->add_option("channel", channel, "Channel")->required();
    cobraSubscribeApp->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* cobraPublish = app.add_subcommand("cobra_publish", "Cobra publisher");
    cobraPublish->add_option("--appkey", appkey, "Appkey");
    cobraPublish->add_option("--endpoint", endpoint, "Endpoint");
    cobraPublish->add_option("--rolename", rolename, "Role name");
    cobraPublish->add_option("--rolesecret", rolesecret, "Role secret");
    cobraPublish->add_option("channel", channel, "Channel")->required();
    cobraPublish->add_option("--pidfile", pidfile, "Pid file");
    cobraPublish->add_option("path", path, "Path to the file to send")
        ->required()->check(CLI::ExistingPath);
    cobraPublish->add_flag("--stress", stress, "Stress mode");

    CLI::App* cobra2statsd = app.add_subcommand("cobra_to_statsd", "Cobra to statsd");
    cobra2statsd->add_option("--appkey", appkey, "Appkey");
    cobra2statsd->add_option("--endpoint", endpoint, "Endpoint");
    cobra2statsd->add_option("--rolename", rolename, "Role name");
    cobra2statsd->add_option("--rolesecret", rolesecret, "Role secret");
    cobra2statsd->add_option("--host", hostname, "Statsd host");
    cobra2statsd->add_option("--port", statsdPort, "Statsd port");
    cobra2statsd->add_option("--prefix", prefix, "Statsd prefix");
    cobra2statsd->add_option("--fields", fields, "Extract fields for naming the event")->join();
    cobra2statsd->add_option("channel", channel, "Channel")->required();
    cobra2statsd->add_flag("-v", verbose, "Verbose");
    cobra2statsd->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* cobra2sentry = app.add_subcommand("cobra_to_sentry", "Cobra to sentry");
    cobra2sentry->add_option("--appkey", appkey, "Appkey");
    cobra2sentry->add_option("--endpoint", endpoint, "Endpoint");
    cobra2sentry->add_option("--rolename", rolename, "Role name");
    cobra2sentry->add_option("--rolesecret", rolesecret, "Role secret");
    cobra2sentry->add_option("--dsn", dsn, "Sentry DSN");
    cobra2sentry->add_option("--jobs", jobs, "Number of thread sending events to Sentry");
    cobra2sentry->add_option("channel", channel, "Channel")->required();
    cobra2sentry->add_flag("-v", verbose, "Verbose");
    cobra2sentry->add_flag("-s", strict, "Strict mode. Error out when sending to sentry fails");
    cobra2sentry->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* runApp = app.add_subcommand("snake", "Snake server");
    runApp->add_option("--port", port, "Connection url");
    runApp->add_option("--host", hostname, "Hostname");
    runApp->add_option("--pidfile", pidfile, "Pid file");
    runApp->add_option("--redis_hosts", redisHosts, "Redis hosts");
    runApp->add_option("--redis_port", redisPort, "Redis hosts");
    runApp->add_option("--redis_password", redisPassword, "Redis password");
    runApp->add_option("--apps_config_path", appsConfigPath, "Path to auth data")
        ->check(CLI::ExistingPath);
    runApp->add_flag("-v", verbose, "Verbose");

    CLI11_PARSE(app, argc, argv);

    // pid file handling
    if (!pidfile.empty())
    {
        unlink(pidfile.c_str());

        std::ofstream f;
        f.open(pidfile);
        f << getpid();
        f.close();
    }

    int ret = 1;
    if (app.got_subcommand("transfer"))
    {
        ret = ix::ws_transfer_main(port, hostname);
    }
    else if (app.got_subcommand("send"))
    {
        ret = ix::ws_send_main(url, path);
    }
    else if (app.got_subcommand("receive"))
    {
        bool enablePerMessageDeflate = false;
        ret = ix::ws_receive_main(url, enablePerMessageDeflate, delayMs);
    }
    else if (app.got_subcommand("connect"))
    {
        ret = ix::ws_connect_main(url, disableAutomaticReconnection);
    }
    else if (app.got_subcommand("chat"))
    {
        ret = ix::ws_chat_main(url, user);
    }
    else if (app.got_subcommand("echo_server"))
    {
        ret = ix::ws_echo_server_main(port, hostname);
    }
    else if (app.got_subcommand("broadcast_server"))
    {
        ret = ix::ws_broadcast_server_main(port, hostname);
    }
    else if (app.got_subcommand("ping"))
    {
        ret = ix::ws_ping_pong_main(url);
    }
    else if (app.got_subcommand("curl"))
    {
        ret = ix::ws_http_client_main(url, headers, data, headersOnly,
                                      connectTimeOut, transferTimeout,
                                      followRedirects, maxRedirects, verbose,
                                      save, output, compress);
    }
    else if (app.got_subcommand("redis_publish"))
    {
        ret = ix::ws_redis_publish_main(hostname, redisPort, password,
                                        channel, message, count);
    }
    else if (app.got_subcommand("redis_subscribe"))
    {
        ret = ix::ws_redis_subscribe_main(hostname, redisPort, password, channel, verbose);
    }
    else if (app.got_subcommand("cobra_subscribe"))
    {
        ret = ix::ws_cobra_subscribe_main(appkey, endpoint,
                                          rolename, rolesecret,
                                          channel);
    }
    else if (app.got_subcommand("cobra_publish"))
    {
        ret = ix::ws_cobra_publish_main(appkey, endpoint,
                                        rolename, rolesecret,
                                        channel, path, stress);
    }
    else if (app.got_subcommand("cobra_to_statsd"))
    {
        ret = ix::ws_cobra_to_statsd_main(appkey, endpoint,
                                          rolename, rolesecret,
                                          channel, hostname, statsdPort,
                                          prefix, fields, verbose);
    }
    else if (app.got_subcommand("cobra_to_sentry"))
    {
        ret = ix::ws_cobra_to_sentry_main(appkey, endpoint,
                                          rolename, rolesecret,
                                          channel, dsn,
                                          verbose, strict, jobs);
    }
    else if (app.got_subcommand("snake"))
    {
        ret = ix::ws_snake_main(port, hostname,
                                redisHosts, redisPort,
                                redisPassword, verbose,
                                appsConfigPath);
    }

    ix::uninitNetSystem();
    return ret;
}